

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::swap(logger *this,logger *other)

{
  undefined4 uVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  long in_RSI;
  long in_RDI;
  backtracer *in_stack_00000038;
  backtracer *in_stack_00000040;
  __int_type_conflict my_level;
  __int_type_conflict other_level;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *in_stack_ffffffffffffff00;
  
  std::__cxx11::string::swap((string *)(in_RDI + 8));
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::swap(in_stack_ffffffffffffff00,
         (vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
          *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  uVar1 = *(undefined4 *)(in_RDI + 0x40);
  *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RSI + 0x40);
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined4 *)(in_RSI + 0x40) = uVar1;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  uVar1 = *(undefined4 *)(in_RDI + 0x44);
  *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RSI + 0x44);
  UNLOCK();
  this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)(in_RSI + 0x44);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined4 *)&(this_00->super__Function_base)._M_functor = uVar1;
  UNLOCK();
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::swap(this_00,in_stack_fffffffffffffee8);
  std::swap<spdlog::details::backtracer>(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

SPDLOG_INLINE void logger::swap(spdlog::logger &other) SPDLOG_NOEXCEPT {
    name_.swap(other.name_);
    sinks_.swap(other.sinks_);

    // swap level_
    auto other_level = other.level_.load();
    auto my_level = level_.exchange(other_level);
    other.level_.store(my_level);

    // swap flush level_
    other_level = other.flush_level_.load();
    my_level = flush_level_.exchange(other_level);
    other.flush_level_.store(my_level);

    custom_err_handler_.swap(other.custom_err_handler_);
    std::swap(tracer_, other.tracer_);
}